

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_JoinerEnableall_Test::TestBody
          (InterpreterTestSuite_PC_JoinerEnableall_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  element_type *this_00;
  bool bVar4;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pTVar5;
  pointer *__ptr;
  char *in_R9;
  Value value;
  TestContext ctx;
  Matcher<ot::commissioner::JoinerType> local_2f8;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2e0;
  _Any_data local_2c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  char local_290 [8];
  char local_288 [16];
  _Alloc_hider local_278;
  char local_268 [16];
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  testing local_228 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_218;
  undefined1 local_200 [8];
  _Alloc_hider local_1f8;
  element_type *local_1f0;
  undefined1 local_1e8 [16];
  _Alloc_hider local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  undefined **local_1c8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  Error local_1b0;
  Error local_188;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  this_00 = local_160.mDefaultCommissionerObject.
            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  testing::Matcher<ot::commissioner::JoinerType>::Matcher(&local_2f8,kMeshCoP);
  testing::StrEq<char[4]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2a0,(StringLike<char[4]> *)"psk");
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_2e0,(PolymorphicMatcher *)local_2a0);
  testing::StrEq<char[20]>(&local_258,(StringLike<char[20]> *)0x2debca);
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_218,(PolymorphicMatcher *)&local_258)
  ;
  CommissionerAppMock::gmock_EnableAllJoiners
            ((MockSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_200,this_00,&local_2f8,&local_2e0,&local_218);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::
           MockSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_200,
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                      ,0x6f4,"*ctx.mDefaultCommissionerObject",
                      "EnableAllJoiners(JoinerType::kMeshCoP, StrEq(\"psk\"), StrEq(\"url://provision.ing\"))"
                     );
  paVar1 = &local_188.mMessage.field_2;
  local_188.mCode = kNone;
  local_188.mMessage._M_string_length = 0;
  local_188.mMessage.field_2._M_local_buf[0] = '\0';
  local_188.mMessage._M_dataplus._M_p = (pointer)paVar1;
  testing::Return<ot::commissioner::Error>(local_228,&local_188);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_2c8,(ReturnAction *)local_228);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(pTVar5,(Action<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_2c8);
  if (local_2b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_2b8)(&local_2c8,&local_2c8,3);
  }
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.mMessage._M_dataplus._M_p);
  }
  local_1c8[0] = &PTR__MatcherBase_00397248;
  if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
  }
  local_1e8._8_8_ = &PTR__MatcherBase_003968b0;
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  local_1f8._M_p = (pointer)&PTR__MatcherBase_003968b0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1e8._1_7_,local_1e8[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1e8._1_7_,local_1e8[0]));
  }
  local_218.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003968b0;
  if (local_218.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  paVar1 = &local_258.impl_.string_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.impl_.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_258.impl_.string_._M_dataplus._M_p);
  }
  local_2e0.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003968b0;
  if (local_2e0.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2a0 != (undefined1  [8])local_290) {
    operator_delete((void *)local_2a0);
  }
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00397248;
  if (local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  testing::Matcher<ot::commissioner::JoinerType>::Matcher(&local_2f8,kAE);
  testing::StrEq<char[1]>
            ((PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2a0,(StringLike<char[1]> *)0x2ff875);
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_2e0,(PolymorphicMatcher *)local_2a0);
  testing::StrEq<char[1]>(&local_258,(StringLike<char[1]> *)0x2ff875);
  testing::PolymorphicMatcher::operator_cast_to_Matcher(&local_218,(PolymorphicMatcher *)&local_258)
  ;
  CommissionerAppMock::gmock_EnableAllJoiners
            ((MockSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_200,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_2f8,
             &local_2e0,&local_218);
  testing::internal::GetWithoutMatchers();
  pTVar5 = testing::internal::
           MockSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::InternalExpectedAt
                     ((MockSpec<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)local_200,
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                      ,0x6f7,"*ctx.mDefaultCommissionerObject",
                      "EnableAllJoiners(JoinerType::kAE, StrEq(\"\"), StrEq(\"\"))");
  paVar2 = &local_1b0.mMessage.field_2;
  local_1b0.mCode = kNone;
  local_1b0.mMessage._M_string_length = 0;
  local_1b0.mMessage.field_2._M_local_buf[0] = '\0';
  local_1b0.mMessage._M_dataplus._M_p = (pointer)paVar2;
  testing::Return<ot::commissioner::Error>(local_228,&local_1b0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_2c8,(ReturnAction *)local_228);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(pTVar5,(Action<ot::commissioner::Error_(ot::commissioner::JoinerType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_2c8);
  if (local_2b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_2b8)(&local_2c8,&local_2c8,3);
  }
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.mMessage._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0.mMessage._M_dataplus._M_p);
  }
  local_1c8[0] = &PTR__MatcherBase_00397248;
  if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
  }
  local_1e8._8_8_ = &PTR__MatcherBase_003968b0;
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  local_1f8._M_p = (pointer)&PTR__MatcherBase_003968b0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1e8._1_7_,local_1e8[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1e8._1_7_,local_1e8[0]));
  }
  local_218.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003968b0;
  if (local_218.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.impl_.string_._M_dataplus._M_p != paVar1) {
    operator_delete(local_258.impl_.string_._M_dataplus._M_p);
  }
  local_2e0.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003968b0;
  if (local_2e0.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2a0 != (undefined1  [8])local_290) {
    operator_delete((void *)local_2a0);
  }
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_00397248;
  if (local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2c8._M_unused._M_object = (pointer)0x0;
  local_2c8._8_8_ = 0;
  local_200._0_4_ = kNone;
  local_1f0 = (element_type *)0x0;
  local_1e8[0] = '\0';
  local_1d8._M_p = (pointer)local_1c8;
  local_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8[0] = (undefined **)((ulong)local_1c8[0] & 0xffffffffffffff00);
  local_2a0 = (undefined1  [8])local_290;
  local_1f8._M_p = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a0,"joiner enableall meshcop psk url://provision.ing","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2f8,&local_160.mInterpreter,(string *)local_2a0);
  local_258.impl_.string_.field_2._M_allocated_capacity = (size_type)local_2b8;
  local_258.impl_.string_._M_string_length = local_2c8._8_8_;
  local_258.impl_.string_._M_dataplus._M_p = (pointer)local_2c8._M_unused._0_8_;
  local_2b8 = local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  local_2c8._M_unused._M_object =
       local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase;
  local_2c8._8_8_ =
       local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
       super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase = (_func_int **)0x0;
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  if (local_2a0 != (undefined1  [8])local_290) {
    operator_delete((void *)local_2a0);
  }
  ot::commissioner::Interpreter::Eval
            ((Value *)local_2a0,&local_160.mInterpreter,(Expression *)&local_2c8);
  local_200._0_4_ = local_2a0._0_4_;
  std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_298);
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_278);
  if (local_278._M_p != local_268) {
    operator_delete(local_278._M_p);
  }
  if (local_298._M_p != local_288) {
    operator_delete(local_298._M_p);
  }
  bVar4 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_200);
  local_258.impl_.string_._M_dataplus._M_p._0_1_ = bVar4;
  local_258.impl_.string_._M_string_length = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)&local_258,(AssertionResult *)0x2ddeee,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x6ff,(char *)local_2a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0);
    }
    if (local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      (**(code **)(*local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase + 8)
      )();
    }
    sVar3 = local_258.impl_.string_._M_string_length;
    if ((undefined8 *)local_258.impl_.string_._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_258.impl_.string_._M_string_length !=
          (undefined8 *)(local_258.impl_.string_._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_258.impl_.string_._M_string_length);
      }
      operator_delete((void *)sVar3);
    }
  }
  local_2a0 = (undefined1  [8])local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"joiner enableall ae","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2f8,&local_160.mInterpreter,(string *)local_2a0);
  local_258.impl_.string_.field_2._M_allocated_capacity = (size_type)local_2b8;
  local_258.impl_.string_._M_string_length = local_2c8._8_8_;
  local_258.impl_.string_._M_dataplus._M_p = (pointer)local_2c8._M_unused._0_8_;
  local_2b8 = local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  local_2c8._M_unused._M_object =
       local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase;
  local_2c8._8_8_ =
       local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
       super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase = (_func_int **)0x0;
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_2f8.super_MatcherBase<ot::commissioner::JoinerType>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::JoinerType_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  if (local_2a0 != (undefined1  [8])local_290) {
    operator_delete((void *)local_2a0);
  }
  ot::commissioner::Interpreter::Eval
            ((Value *)local_2a0,&local_160.mInterpreter,(Expression *)&local_2c8);
  local_200._0_4_ = local_2a0._0_4_;
  std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_298);
  std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_278);
  if (local_278._M_p != local_268) {
    operator_delete(local_278._M_p);
  }
  if (local_298._M_p != local_288) {
    operator_delete(local_298._M_p);
  }
  bVar4 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_200);
  local_258.impl_.string_._M_dataplus._M_p._0_1_ = bVar4;
  local_258.impl_.string_._M_string_length = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_2f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)&local_258,(AssertionResult *)0x2ddeee,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x703,(char *)local_2a0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2e0,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2e0);
    if (local_2a0 != (undefined1  [8])local_290) {
      operator_delete((void *)local_2a0);
    }
    if (local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      (**(code **)(*local_2f8.super_MatcherBase<ot::commissioner::JoinerType>._vptr_MatcherBase + 8)
      )();
    }
    sVar3 = local_258.impl_.string_._M_string_length;
    if ((undefined8 *)local_258.impl_.string_._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_258.impl_.string_._M_string_length !=
          (undefined8 *)(local_258.impl_.string_._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_258.impl_.string_._M_string_length);
      }
      operator_delete((void *)sVar3);
    }
  }
  if ((element_type *)local_1d8._M_p != (element_type *)local_1c8) {
    operator_delete(local_1d8._M_p);
  }
  if (local_1f8._M_p != local_1e8) {
    operator_delete(local_1f8._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c8);
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_JoinerEnableall)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject,
                EnableAllJoiners(JoinerType::kMeshCoP, StrEq("psk"), StrEq("url://provision.ing")))
        .WillOnce(Return(Error{}));

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, EnableAllJoiners(JoinerType::kAE, StrEq(""), StrEq("")))
        .WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("joiner enableall meshcop psk url://provision.ing");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("joiner enableall ae");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}